

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qregion.cpp
# Opt level: O3

QRegion __thiscall QRegion::united(QRegion *this,QRegion *r)

{
  int iVar1;
  int iVar2;
  QRegionPrivate *this_00;
  QRegionPrivate *r_00;
  bool bVar3;
  QRect *pQVar4;
  QRect *pQVar5;
  QRegion *in_RDX;
  QRegion *r_01;
  
  this_00 = r->d->qt_rgn;
  r_01 = in_RDX;
  if (this_00 != (QRegionPrivate *)0x0) {
    iVar1 = this_00->numRects;
    if ((long)iVar1 != 0) {
      r_00 = in_RDX->d->qt_rgn;
      r_01 = r;
      if (((((r_00 != (QRegionPrivate *)0x0) && (r_00->numRects != 0)) && (r->d != in_RDX->d)) &&
          ((((r_00->extents).x1.m_i < (this_00->innerRect).x1.m_i ||
            ((this_00->innerRect).x2.m_i < (r_00->extents).x2.m_i)) ||
           (((r_00->extents).y1.m_i < (this_00->innerRect).y1.m_i ||
            ((this_00->innerRect).y2.m_i < (r_00->extents).y2.m_i)))))) &&
         ((((this_00->extents).x1.m_i < (r_00->innerRect).x1.m_i ||
           ((r_00->innerRect).x2.m_i < (this_00->extents).x2.m_i)) ||
          (((this_00->extents).y1.m_i < (r_00->innerRect).y1.m_i ||
           (r_01 = in_RDX, (r_00->innerRect).y2.m_i < (this_00->extents).y2.m_i)))))) {
        if (r_00->numRects == 1) {
          pQVar5 = &r_00->extents;
        }
        else {
          pQVar5 = (r_00->rects).d.ptr;
        }
        pQVar4 = (this_00->rects).d.ptr + (long)iVar1 + -1;
        if (iVar1 == 1) {
          pQVar4 = &this_00->extents;
        }
        iVar1 = (pQVar5->y1).m_i;
        iVar2 = (pQVar4->y2).m_i;
        if ((iVar2 < iVar1) ||
           (((iVar1 == (pQVar4->y1).m_i && ((pQVar5->y2).m_i == iVar2)) &&
            ((pQVar4->x2).m_i < (pQVar5->x1).m_i)))) {
          this->d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
          QRegion(this,r);
          detach(this);
          QRegionPrivate::append(this->d->qt_rgn,in_RDX->d->qt_rgn);
          return (QRegion)(QRegionData *)this;
        }
        bVar3 = QRegionPrivate::canPrepend(this_00,r_00);
        if (bVar3) {
          this->d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
          QRegion(this,r);
          detach(this);
          QRegionPrivate::prepend(this->d->qt_rgn,in_RDX->d->qt_rgn);
          return (QRegion)(QRegionData *)this;
        }
        bVar3 = EqualRegion(r->d->qt_rgn,in_RDX->d->qt_rgn);
        r_01 = r;
        if (!bVar3) {
          this->d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
          QRegion(this);
          detach(this);
          UnionRegion(r->d->qt_rgn,in_RDX->d->qt_rgn,this->d->qt_rgn);
          return (QRegion)(QRegionData *)this;
        }
      }
    }
  }
  QRegion(this,r_01);
  return (QRegion)(QRegionData *)this;
}

Assistant:

QRegion QRegion::united(const QRegion &r) const
{
    if (isEmptyHelper(d->qt_rgn))
        return r;
    if (isEmptyHelper(r.d->qt_rgn))
        return *this;
    if (d == r.d)
        return *this;

    if (d->qt_rgn->contains(*r.d->qt_rgn)) {
        return *this;
    } else if (r.d->qt_rgn->contains(*d->qt_rgn)) {
        return r;
    } else if (d->qt_rgn->canAppend(r.d->qt_rgn)) {
        QRegion result(*this);
        result.detach();
        result.d->qt_rgn->append(r.d->qt_rgn);
        return result;
    } else if (d->qt_rgn->canPrepend(r.d->qt_rgn)) {
        QRegion result(*this);
        result.detach();
        result.d->qt_rgn->prepend(r.d->qt_rgn);
        return result;
    } else if (EqualRegion(d->qt_rgn, r.d->qt_rgn)) {
        return *this;
    } else {
        QRegion result;
        result.detach();
        UnionRegion(d->qt_rgn, r.d->qt_rgn, *result.d->qt_rgn);
        return result;
    }
}